

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adjointstepper.c
# Opt level: O0

SUNErrCode
SUNAdjointStepper_RecomputeFwd
          (SUNAdjointStepper self,suncountertype start_idx,sunrealtype t0,N_Vector y0,sunrealtype tf
          )

{
  long *in_RDI;
  sunrealtype *in_XMM0_Qa;
  SUNStepper in_XMM1_Qa;
  SUNStepper_conflict fwd_stepper;
  sunrealtype fwd_t;
  SUNErrCode retcode;
  SUNContext_conflict sunctx_local_scope_;
  uint in_stack_ffffffffffffffc8;
  SUNErrCode SVar1;
  sunrealtype tout;
  
  tout = (sunrealtype)in_RDI[8];
  SVar1 = 0;
  SUNStepper_Reset((SUNStepper)(ulong)in_stack_ffffffffffffffc8,(sunrealtype)in_XMM0_Qa,
                   (N_Vector)in_RDI[3]);
  SUNStepper_ResetCheckpointIndex
            ((SUNStepper)CONCAT44(SVar1,in_stack_ffffffffffffffc8),(suncountertype)in_XMM0_Qa);
  SUNAdjointCheckpointScheme_EnableDense
            ((SUNAdjointCheckpointScheme_conflict)CONCAT44(SVar1,in_stack_ffffffffffffffc8),
             (int)((ulong)in_XMM0_Qa >> 0x20));
  SUNStepper_SetStopTime
            ((SUNStepper)CONCAT44(SVar1,in_stack_ffffffffffffffc8),(sunrealtype)in_XMM0_Qa);
  SUNStepper_Evolve(in_XMM1_Qa,tout,(N_Vector)CONCAT44(SVar1,in_stack_ffffffffffffffc8),in_XMM0_Qa);
  *in_RDI = *in_RDI + 1;
  SUNAdjointCheckpointScheme_EnableDense
            ((SUNAdjointCheckpointScheme_conflict)CONCAT44(SVar1,in_stack_ffffffffffffffc8),
             (int)((ulong)in_XMM0_Qa >> 0x20));
  return SVar1;
}

Assistant:

SUNErrCode SUNAdjointStepper_RecomputeFwd(SUNAdjointStepper self,
                                          suncountertype start_idx,
                                          sunrealtype t0, N_Vector y0,
                                          sunrealtype tf)
{
  SUNFunctionBegin(self->sunctx);

  SUNErrCode retcode = SUN_SUCCESS;

  sunrealtype fwd_t      = t0;
  SUNStepper fwd_stepper = self->fwd_sunstepper;
  SUNCheckCall(SUNStepper_Reset(fwd_stepper, t0, y0));
  SUNCheckCall(SUNStepper_ResetCheckpointIndex(fwd_stepper, start_idx));

  SUNCheckCall(SUNAdjointCheckpointScheme_EnableDense(self->checkpoint_scheme, 1));

  SUNCheckCall(SUNStepper_SetStopTime(fwd_stepper, tf));

  SUNCheckCall(SUNStepper_Evolve(fwd_stepper, tf, y0, &fwd_t));
  self->nrecompute++;

  SUNCheckCall(SUNAdjointCheckpointScheme_EnableDense(self->checkpoint_scheme, 0));

  return retcode;
}